

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O2

void __thiscall Threadpool<Searchthread>::thread_func(Threadpool<Searchthread> *this)

{
  unique_lock<std::mutex> lock;
  value_type fn;
  unique_lock<std::mutex> local_60;
  function<void_()> local_50;
  
  do {
    std::unique_lock<std::mutex>::unique_lock(&local_60,&this->m);
    std::condition_variable::wait<Threadpool<Searchthread>::thread_func()::_lambda()_1_>
              (&this->cv_task,&local_60,(anon_class_8_1_8991fb9c)this);
    if ((this->tasks).
        super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        (this->tasks).
        super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      if (((this->stop)._M_base._M_i & 1U) != 0) {
        std::unique_lock<std::mutex>::~unique_lock(&local_60);
        return;
      }
    }
    else {
      LOCK();
      (this->busy).super___atomic_base<unsigned_int>._M_i =
           (this->busy).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      std::function<void_()>::function
                (&local_50,
                 (this->tasks).
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur);
      std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
                (&this->tasks);
      std::unique_lock<std::mutex>::unlock(&local_60);
      std::function<void_()>::operator()(&local_50);
      LOCK();
      (this->processed).super___atomic_base<unsigned_int>._M_i =
           (this->processed).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      std::unique_lock<std::mutex>::lock(&local_60);
      LOCK();
      (this->busy).super___atomic_base<unsigned_int>._M_i =
           (this->busy).super___atomic_base<unsigned_int>._M_i - 1;
      UNLOCK();
      std::condition_variable::notify_one();
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_60);
  } while( true );
}

Assistant:

void thread_func() {
		while (true) {
			std::unique_lock<std::mutex> lock(m);
			cv_task.wait(lock, [this]() { return stop || !tasks.empty(); });
			if (!tasks.empty()) {
				++busy;
				auto fn = tasks.front();
				tasks.pop_front();
				lock.unlock();
				fn();
				++processed;
				lock.lock();
				--busy;
				cv_finished.notify_one();
			}
			else if (stop) break;
		}
	}